

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# code_writers.h
# Opt level: O0

void cppwinrt::write_composable_constructor_definition
               (writer *w,MethodDef *method,TypeDef *type,TypeDef *factory)

{
  uint32_t *args;
  bool bVar1;
  reference pvVar2;
  string_view sVar3;
  char *local_1d0;
  anon_class_8_1_89897ddb_conflict1 local_1c8;
  basic_string_view<char,_std::char_traits<char>_> local_1c0;
  anon_class_16_2_3ed68039_conflict3 local_1b0;
  anon_class_8_1_89897ddb_conflict1 local_1a0;
  basic_string_view<char,_std::char_traits<char>_> local_198;
  char *local_188;
  char *format;
  string_view base_param;
  undefined1 local_160 [8];
  string_view inner_param;
  vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
  *params;
  method_signature signature;
  string_view type_name;
  TypeDef *factory_local;
  TypeDef *type_local;
  MethodDef *method_local;
  writer *w_local;
  
  join_0x00000010_0x00000000_ = winmd::reader::TypeDef::TypeName(type);
  method_signature::method_signature((method_signature *)&params,method);
  inner_param._M_str = (char *)method_signature::params((method_signature *)&params);
  pvVar2 = std::
           vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
           ::back((vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
                   *)inner_param._M_str);
  sVar3 = winmd::reader::Param::Name(&pvVar2->first);
  inner_param._M_len = (size_t)sVar3._M_str;
  local_160 = (undefined1  [8])sVar3._M_len;
  std::
  vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
  ::pop_back((vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
              *)inner_param._M_str);
  pvVar2 = std::
           vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
           ::back((vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
                   *)inner_param._M_str);
  sVar3 = winmd::reader::Param::Name(&pvVar2->first);
  base_param._M_len = (size_t)sVar3._M_str;
  format = (char *)sVar3._M_len;
  std::
  vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
  ::pop_back((vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
              *)inner_param._M_str);
  local_188 = 
  "    inline %::%(%)\n    {\n        winrt::Windows::Foundation::IInspectable %, %;\n        *this = % { return f.%(%%%, %); });\n    }\n"
  ;
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            (&local_198,
             "    inline %::%(%)\n    {\n        winrt::Windows::Foundation::IInspectable %, %;\n        *this = % { return f.%(%%%, %); });\n    }\n"
            );
  local_1a0 = bind<&cppwinrt::write_consume_params,_cppwinrt::method_signature_&>
                        ((method_signature *)&params);
  local_1b0 = bind<&cppwinrt::write_call_factory,_const_winmd::reader::TypeDef_&,_const_winmd::reader::TypeDef_&>
                        (type,factory);
  local_1c0 = get_name(method);
  local_1c8 = bind<&cppwinrt::write_consume_args,_cppwinrt::method_signature_&>
                        ((method_signature *)&params);
  bVar1 = std::
          vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
          ::empty((vector<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>,_std::allocator<std::pair<winmd::reader::Param,_const_winmd::reader::ParamSig_*>_>_>
                   *)inner_param._M_str);
  local_1d0 = ", ";
  if (bVar1) {
    local_1d0 = "";
  }
  args = &signature.m_return.super_row_base<winmd::reader::Param>.m_index;
  writer_base<cppwinrt::writer>::
  write<std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_std::basic_string_view<char,_std::char_traits<char>_>,_(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_oldnewthing[P]cppwinrt_cppwinrt_text_writer_h:428:16),_const_char_*,_std::basic_string_view<char,_std::char_traits<char>_>,_std::basic_string_view<char,_std::char_traits<char>_>_>
            (&w->super_writer_base<cppwinrt::writer>,&local_198,
             (basic_string_view<char,_std::char_traits<char>_> *)args,
             (basic_string_view<char,_std::char_traits<char>_> *)args,&local_1a0,
             (basic_string_view<char,_std::char_traits<char>_> *)&format,
             (basic_string_view<char,_std::char_traits<char>_> *)local_160,&local_1b0,&local_1c0,
             &local_1c8,&local_1d0,(basic_string_view<char,_std::char_traits<char>_> *)&format,
             (basic_string_view<char,_std::char_traits<char>_> *)local_160);
  method_signature::~method_signature((method_signature *)&params);
  return;
}

Assistant:

static void write_composable_constructor_definition(writer& w, MethodDef const& method, TypeDef const& type, TypeDef const& factory)
    {
        auto type_name = type.TypeName();
        method_signature signature{ method };
        auto& params = signature.params();
        auto inner_param = params.back().first.Name();
        params.pop_back();
        auto base_param = params.back().first.Name();
        params.pop_back();

        auto format = R"(    inline %::%(%)
    {
        winrt::Windows::Foundation::IInspectable %, %;
        *this = % { return f.%(%%%, %); });
    }
)";

        w.write(format,
            type_name,
            type_name,
            bind<write_consume_params>(signature),
            base_param,
            inner_param,
            bind<write_call_factory>(type, factory),
            get_name(method),
            bind<write_consume_args>(signature),
            params.empty() ? "" : ", ",
            base_param,
            inner_param);
    }